

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O3

void __thiscall
solitaire::SolitaireHandWithOneCardAddCardTest_addCardOnFoundationPileWithHistoryRecord_Test::
~SolitaireHandWithOneCardAddCardTest_addCardOnFoundationPileWithHistoryRecord_Test
          (SolitaireHandWithOneCardAddCardTest_addCardOnFoundationPileWithHistoryRecord_Test *this)

{
  StrictMock<solitaire::archivers::SnapshotMock> *pSVar1;
  
  (this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
  super_SolitaireEmptyHandTest.super_SolitaireTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SolitaireHandWithOneCardAddCardTest_0031d1b8;
  if (((this->super_SolitaireHandWithOneCardAddCardTest).moveOperationSnapshot.
       isUniquePointerCreated == false) &&
     (pSVar1 = (this->super_SolitaireHandWithOneCardAddCardTest).moveOperationSnapshot.rawPointer,
     pSVar1 != (StrictMock<solitaire::archivers::SnapshotMock> *)0x0)) {
    (*(pSVar1->super_SnapshotMock).super_Snapshot._vptr_Snapshot[1])();
  }
  if (((this->super_SolitaireHandWithOneCardAddCardTest).snapshotMock2.isUniquePointerCreated ==
       false) &&
     (pSVar1 = (this->super_SolitaireHandWithOneCardAddCardTest).snapshotMock2.rawPointer,
     pSVar1 != (StrictMock<solitaire::archivers::SnapshotMock> *)0x0)) {
    (*(pSVar1->super_SnapshotMock).super_Snapshot._vptr_Snapshot[1])();
  }
  (this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
  super_SolitaireEmptyHandTest.super_SolitaireTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SolitaireEmptyHandTest_0031c810;
  if (((this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
       super_SolitaireEmptyHandTest.snapshotMock.isUniquePointerCreated == false) &&
     (pSVar1 = (this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
               super_SolitaireEmptyHandTest.snapshotMock.rawPointer,
     pSVar1 != (StrictMock<solitaire::archivers::SnapshotMock> *)0x0)) {
    (*(pSVar1->super_SnapshotMock).super_Snapshot._vptr_Snapshot[1])();
  }
  SolitaireTest::~SolitaireTest((SolitaireTest *)this);
  operator_delete(this,0x238);
  return;
}

Assistant:

TEST_F(SolitaireHandWithOneCardAddCardTest, addCardOnFoundationPileWithHistoryRecord) {
    std::optional<Card> cardToAdd {oneCard.back()};

    InSequence seq;
    expectSnapshotCreation(lastFoundationPileMock, snapshotMock2);
    expectTryingAddCardAndClearIt(lastFoundationPileMock, cardToAdd);
    expectMoveOperationSnapshotCreation(snapshotMock2)
        .WillOnce(Return(ByMove(moveOperationSnapshot.make_unique())));
    EXPECT_CALL(*historyTrackerMock, save(Pointer(moveOperationSnapshot.get())));

    solitaire.tryAddCardOnFoundationPile(lastFoundationPileId);
    EXPECT_TRUE(solitaire.getCardsInHand().empty());
}